

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

void __thiscall
Arcflow::lift_state(Arcflow *this,vector<int,_std::allocator<int>_> *valid_opts,
                   vector<int,_std::allocator<int>_> *u,int it,int ic)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  int *piVar9;
  const_iterator __begin4;
  int *piVar10;
  const_iterator __end4;
  long lVar11;
  long *plVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> caps;
  vector<int,_std::allocator<int>_> space;
  vector<int,_std::allocator<int>_> local_98;
  int local_74;
  long local_70;
  long local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  if (it < (this->inst).nsizes) {
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,(long)(this->inst).ndims,(allocator_type *)&local_60);
    if (0 < (this->inst).ndims) {
      piVar3 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar11 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar11] = piVar3[lVar11] - piVar4[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->inst).ndims);
    }
    count_max_rep(&local_60,this,&local_48,it,ic);
    if (0 < (this->inst).ndims) {
      local_68 = (long)it + 1;
      local_70 = (long)it * 0x18;
      lVar11 = 0;
      do {
        iVar6 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        piVar10 = (valid_opts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 = (valid_opts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar10 != piVar5) {
          piVar9 = piVar10;
          do {
            iVar1 = *(int *)(*(long *)&(this->inst).Ws.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[*piVar9].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + lVar11 * 4);
            if (iVar1 < iVar6) {
              iVar6 = iVar1;
            }
            piVar9 = piVar9 + 1;
          } while (piVar9 != piVar5);
        }
        piVar3 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
        iVar1 = piVar3[lVar11];
        if (iVar1 != iVar6) {
          iVar2 = (this->inst).nsizes;
          if ((it < iVar2) && (iVar1 <= iVar6)) {
            plVar12 = (long *)((long)&(((this->weights).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data + local_70);
            lVar13 = local_68;
            do {
              iVar6 = iVar6 - *(int *)(*plVar12 + lVar11 * 4) *
                              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar13 + -1];
              if (iVar2 <= lVar13) break;
              lVar13 = lVar13 + 1;
              plVar12 = plVar12 + 3;
            } while (iVar1 <= iVar6);
          }
          if (iVar6 < iVar1) {
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (int *)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (int *)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (int *)0x0;
            for (; piVar4 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                piVar3 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start, piVar10 != piVar5; piVar10 = piVar10 + 1)
            {
              local_74 = *(int *)(*(long *)&(this->inst).Ws.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[*piVar10].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + lVar11 * 4) -
                         (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
              if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_98,
                           (iterator)
                           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_74);
              }
              else {
                *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_74;
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar7 = (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2;
            if (1 < uVar7) {
              if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                lVar13 = 0x3f;
                if (uVar7 != 0) {
                  for (; uVar7 >> lVar13 == 0; lVar13 = lVar13 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (piVar3,piVar4);
              }
              _Var8 = std::
                      __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish);
              if ((_Var8._M_current !=
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) &&
                 (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != _Var8._M_current)) {
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)_Var8;
              }
            }
            iVar6 = min_slack(this,&local_60,it,(int)lVar11,&local_98);
            piVar10 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar11;
            *piVar10 = *piVar10 + iVar6;
            if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (int *)0x0) {
              operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            piVar3[lVar11] = iVar6;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->inst).ndims);
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Arcflow::lift_state(const std::vector<int> &valid_opts, std::vector<int> &u, int it,
						 int ic) const {
	if (it >= inst.nsizes) {
		return;
	}
	std::vector<int> space(inst.ndims);
	for (int d = 0; d < inst.ndims; d++) {
		space[d] = maxW[d] - u[d];
	}
	const std::vector<int> &r = count_max_rep(space, it, ic);
	for (int d = 0; d < inst.ndims; d++) {
		int minw = maxW[d];
		for (int t : valid_opts) {
			minw = std::min(minw, inst.Ws[t][d]);
		}
		if (u[d] != minw) {
			// lift method 1
			int maxpos = minw;
			for (int i = it; i < inst.nsizes && maxpos >= u[d]; i++) {
				maxpos -= r[i] * weights[i][d];
			}
			if (maxpos >= u[d]) {
				u[d] = maxpos;
			} else {
				// lift method 2
				std::vector<int> caps;
				for (int t : valid_opts) {
					caps.push_back(inst.Ws[t][d] - u[d]);
				}
				if (caps.size() > 1) {
					sort(all(caps));
					caps.erase(unique(all(caps)), caps.end());
				}
				u[d] += min_slack(r, it, d, caps);
			}
		}
	}
}